

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CodedInputStream::Skip(CodedInputStream *this,int count)

{
  uint8 *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  if (-1 < count) {
    puVar1 = this->buffer_;
    iVar3 = (int)this->buffer_end_ - (int)puVar1;
    iVar4 = count - iVar3;
    if (iVar4 == 0 || count < iVar3) {
      this->buffer_ = puVar1 + (uint)count;
      return true;
    }
    if (this->buffer_size_after_limit_ < 1) {
      this->buffer_ = (uint8 *)0x0;
      this->buffer_end_ = (uint8 *)0x0;
      iVar3 = this->current_limit_;
      if (this->total_bytes_limit_ < this->current_limit_) {
        iVar3 = this->total_bytes_limit_;
      }
      uVar2 = iVar3 - this->total_bytes_read_;
      if (iVar4 <= (int)uVar2) {
        this->total_bytes_read_ = this->total_bytes_read_ + iVar4;
        iVar3 = (*this->input_->_vptr_ZeroCopyInputStream[4])();
        return SUB41(iVar3,0);
      }
      if (0 < (int)uVar2) {
        this->total_bytes_read_ = iVar3;
        (*this->input_->_vptr_ZeroCopyInputStream[4])(this->input_,(ulong)uVar2);
        return false;
      }
    }
    else {
      this->buffer_ = puVar1 + iVar3;
    }
  }
  return false;
}

Assistant:

bool CodedInputStream::Skip(int count) {
  if (count < 0) return false;  // security: count is often user-supplied

  const int original_buffer_size = BufferSize();

  if (count <= original_buffer_size) {
    // Just skipping within the current buffer.  Easy.
    Advance(count);
    return true;
  }

  if (buffer_size_after_limit_ > 0) {
    // We hit a limit inside this buffer.  Advance to the limit and fail.
    Advance(original_buffer_size);
    return false;
  }

  count -= original_buffer_size;
  buffer_ = NULL;
  buffer_end_ = buffer_;

  // Make sure this skip doesn't try to skip past the current limit.
  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  int bytes_until_limit = closest_limit - total_bytes_read_;
  if (bytes_until_limit < count) {
    // We hit the limit.  Skip up to it then fail.
    if (bytes_until_limit > 0) {
      total_bytes_read_ = closest_limit;
      input_->Skip(bytes_until_limit);
    }
    return false;
  }

  total_bytes_read_ += count;
  return input_->Skip(count);
}